

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkRestrashWithLatches(Abc_Ntk_t *pNtk,int nLatches)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  Abc_Ntk_t *pNtkNew;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pNtkNew = Abc_NtkStartFromWithLatches(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG,nLatches);
    pVVar6 = pNtk->vObjs;
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        plVar2 = (long *)pVVar6->pArray[lVar7];
        if ((plVar2 != (long *)0x0) && (uVar1 = *(uint *)((long)plVar2 + 0x14), (uVar1 & 0xf) == 7))
        {
          lVar3 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
          pAVar5 = Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc,
                              (Abc_Obj_t *)
                              ((ulong)(uVar1 >> 10 & 1) ^
                              *(ulong *)(*(long *)(lVar3 + (long)*(int *)plVar2[4] * 8) + 0x40)),
                              (Abc_Obj_t *)
                              ((ulong)(uVar1 >> 0xb & 1) ^
                              *(ulong *)(*(long *)(lVar3 + (long)((int *)plVar2[4])[1] * 8) + 0x40))
                             );
          plVar2[8] = (long)pAVar5;
          pVVar6 = pNtk->vObjs;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar6->nSize);
    }
    Abc_NtkFinalize(pNtk,pNtkNew);
    iVar4 = Abc_NtkCheck(pNtkNew);
    if (iVar4 == 0) {
      puts("Abc_NtkStrash: The network check has failed.");
      Abc_NtkDelete(pNtkNew);
      pNtkNew = (Abc_Ntk_t *)0x0;
    }
    return pNtkNew;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                ,0x248,"Abc_Ntk_t *Abc_NtkRestrashWithLatches(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkRestrashWithLatches( Abc_Ntk_t * pNtk, int nLatches )
{
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the new network (constants and CIs of the old network will point to the their counterparts in the new network)
    pNtkAig = Abc_NtkStartFromWithLatches( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG, nLatches );
    // restrash the nodes (assuming a topological order of the old network)
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkAig->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // finalize the network
    Abc_NtkFinalize( pNtk, pNtkAig );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;

}